

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall libclient::client::client_loop(client *this)

{
  ostream *poVar1;
  subsecond_duration<boost::posix_time::time_duration,_1000L> local_d8;
  int local_d0;
  allocator<char> local_c9;
  int sl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  client *local_10;
  client *this_local;
  
  local_10 = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"Sending login request");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"lo",&local_71);
  std::operator+(&local_50,&local_70,&this->client_name);
  std::operator+(&local_30,&local_50,"\n");
  _write_to_socket(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  _read_from_socket(this);
  while ((this->_is_started & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&sl,"ping",&local_c9);
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sl,"\n");
    _write_to_socket(this,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&sl);
    std::allocator<char>::~allocator(&local_c9);
    _read_from_socket(this);
    process_message(this);
    local_d0 = rand();
    local_d0 = local_d0 % 7000;
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->client_name);
    poVar1 = std::operator<<(poVar1," ping ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_d0);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    boost::date_time::subsecond_duration<boost::posix_time::time_duration,_1000L>::
    subsecond_duration<int>(&local_d8,&local_d0,(type *)0x0);
    boost::this_thread::
    sleep<boost::date_time::subsecond_duration<boost::posix_time::time_duration,1000l>>(&local_d8);
  }
  return;
}

Assistant:

void libclient::client::client_loop()
{
    /*
        Check if the client has received login success from server and proceed
    */
   std::cout<<"Sending login request"<<std::endl;
   _write_to_socket(_LOGIN_REQUEST_+client_name+"\n");
   _read_from_socket();
   while(_is_started)
   {
       _write_to_socket(_PING_REQUEST_+"\n");
       _read_from_socket();
        process_message();
       int sl = rand()%7000;
       std::cout<<client_name<<" ping "<<sl<<std::endl;
       boost::this_thread::sleep(boost::posix_time::millisec(sl));

   }

}